

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O0

vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_> *
__thiscall wallet::SelectionResult::GetShuffledInputVector(SelectionResult *this)

{
  long lVar1;
  allocator_type *in_RDI;
  long in_FS_OFFSET;
  vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *coins;
  FastRandomContext *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  allocator_type *__a;
  vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *this_00;
  _Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>_> in_stack_ffffffffffffff30;
  _Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>_> in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 uVar2;
  vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  local_91 [2];
  __normal_iterator<std::shared_ptr<wallet::COutput>_*,_std::vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>_>
  in_stack_ffffffffffffffa0;
  __normal_iterator<std::shared_ptr<wallet::COutput>_*,_std::vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>_>
  in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  __a = in_RDI;
  std::
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::begin((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
           *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  std::
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::end((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
         *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  this_00 = local_91;
  std::allocator<std::shared_ptr<wallet::COutput>_>::allocator
            ((allocator<std::shared_ptr<wallet::COutput>_> *)in_stack_fffffffffffffee8);
  std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>::
  vector<std::_Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>>,void>
            (this_00,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,__a);
  std::allocator<std::shared_ptr<wallet::COutput>_>::~allocator
            ((allocator<std::shared_ptr<wallet::COutput>_> *)in_stack_fffffffffffffee8);
  std::vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::begin((vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
           *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  std::vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::end((vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
         *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  FastRandomContext::FastRandomContext
            ((FastRandomContext *)
             ((long)&local_91[0].
                     super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1),(bool)in_stack_fffffffffffffef7)
  ;
  std::
  shuffle<__gnu_cxx::__normal_iterator<std::shared_ptr<wallet::COutput>*,std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>,FastRandomContext>
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             (FastRandomContext *)CONCAT17(uVar2,in_stack_ffffffffffffff50));
  FastRandomContext::~FastRandomContext(in_stack_fffffffffffffee8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          *)in_RDI;
}

Assistant:

std::vector<std::shared_ptr<COutput>> SelectionResult::GetShuffledInputVector() const
{
    std::vector<std::shared_ptr<COutput>> coins(m_selected_inputs.begin(), m_selected_inputs.end());
    std::shuffle(coins.begin(), coins.end(), FastRandomContext());
    return coins;
}